

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

mat<3UL,_3UL> * __thiscall
mat<4UL,_4UL>::get_minor
          (mat<3UL,_3UL> *__return_storage_ptr__,mat<4UL,_4UL> *this,size_t row,size_t col)

{
  double dVar1;
  vec<3UL,_double> *this_00;
  double *pdVar2;
  ulong uVar3;
  ulong i;
  long lVar4;
  ulong idx;
  ulong uVar5;
  
  __return_storage_ptr__->rows[2].x = 0.0;
  __return_storage_ptr__->rows[2].y = 0.0;
  __return_storage_ptr__->rows[1].y = 0.0;
  __return_storage_ptr__->rows[1].z = 0.0;
  __return_storage_ptr__->rows[0].z = 0.0;
  __return_storage_ptr__->rows[1].x = 0.0;
  __return_storage_ptr__->rows[0].x = 0.0;
  __return_storage_ptr__->rows[0].y = 0.0;
  __return_storage_ptr__->rows[2].z = 0.0;
  uVar5 = 3;
  while (idx = uVar5 - 1, uVar5 != 0) {
    uVar3 = uVar5;
    if (idx < row) {
      uVar3 = idx;
    }
    i = 3;
    for (lVar4 = -3; uVar5 = idx, lVar4 != 0; lVar4 = lVar4 + 1) {
      uVar5 = i - 1;
      if (uVar5 < col) {
        i = uVar5;
      }
      dVar1 = vec<4UL,_double>::operator[](this->rows + uVar3,i);
      this_00 = mat<3UL,_3UL>::operator[](__return_storage_ptr__,idx);
      pdVar2 = vec<3UL,_double>::operator[](this_00,uVar5);
      *pdVar2 = dVar1;
      i = uVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<nrows - 1, ncols - 1> get_minor(const size_t row, const size_t col) const
    {
        mat<nrows - 1, ncols - 1> ret;
        for (size_t i = nrows - 1; i--;)
            for (size_t j = ncols - 1; j--;
                 ret[i][j] = rows[i < row ? i : i + 1][j < col ? j : j + 1])
                ;
        return ret;
    }